

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gluTextureTestUtil.cpp
# Opt level: O2

float glu::TextureTestUtil::triDerivateY(Vec3 *s,Vec3 *w,float wy,float height,float nx)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  
  fVar1 = w->m_data[0];
  fVar3 = (float)*(undefined8 *)(w->m_data + 1);
  fVar4 = (float)((ulong)*(undefined8 *)(w->m_data + 1) >> 0x20);
  fVar2 = (height * (nx + -1.0) + wy) * fVar4 * fVar3 + (nx * fVar3 * height + wy * fVar4) * -fVar1;
  return (fVar4 * fVar3 * fVar1 * height *
         ((nx + -1.0) * (s->m_data[0] - s->m_data[1]) * fVar4 +
         (fVar1 * (s->m_data[1] - s->m_data[2]) + (s->m_data[2] - s->m_data[0]) * fVar3) * nx)) /
         (fVar2 * fVar2);
}

Assistant:

static inline float triDerivateY (const tcu::Vec3& s, const tcu::Vec3& w, float wy, float height, float nx)
{
	float d = w[1]*w[2]*(height*(nx - 1.0f) + wy) - w[0]*(w[1]*height*nx + w[2]*wy);
	return (w[0]*w[1]*w[2]*height * (w[2]*(s[0] - s[1])*(nx - 1.0f) + nx*(w[0]*(s[1] - s[2]) + w[1]*(s[2] - s[0])))) / (d*d);
}